

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Utf8ReadLimited(u8 *z,int n,u32 *piOut)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  bVar1 = *z;
  uVar3 = (uint)bVar1;
  uVar2 = 1;
  if (0xbf < bVar1) {
    uVar3 = (uint)""[bVar1 - 0xc0];
    uVar4 = 4;
    if (n < 4) {
      uVar4 = n;
    }
    if (1 < n) {
      uVar2 = 1;
      do {
        if ((z[uVar2] & 0xffffffc0) != 0x80) goto LAB_001bc9c2;
        uVar3 = z[uVar2] & 0x3f | uVar3 << 6;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
      uVar2 = (ulong)uVar4;
    }
  }
LAB_001bc9c2:
  *piOut = uVar3;
  return (int)uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf8ReadLimited(
  const u8 *z,
  int n,
  u32 *piOut
){
  u32 c;
  int i = 1;
  assert( n>0 );
  c = z[0];
  if( c>=0xc0 ){
    c = sqlite3Utf8Trans1[c-0xc0];
    if( n>4 ) n = 4;
    while( i<n && (z[i] & 0xc0)==0x80 ){
      c = (c<<6) + (0x3f & z[i]);
      i++;
    }
  }
  *piOut = c;
  return i;
}